

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

QCborValue * QCborValue::fromCbor(QCborValue *__return_storage_ptr__,QCborStreamReader *reader)

{
  QCborError QVar1;
  QCborContainerPrivate *pQVar2;
  byte bVar3;
  long in_FS_OFFSET;
  Element EVar4;
  QCborValue QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&__return_storage_ptr__->t = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
  __return_storage_ptr__->t = Undefined;
  bVar3 = reader->type_;
  QVar1 = QCborStreamReader::lastError((QCborStreamReader *)reader);
  bVar3 = -(QVar1.c != NoError) | bVar3;
  if (((2 < bVar3 - 0xf9) && (bVar3 != 0)) && (bVar3 != 0x20)) {
    if ((bVar3 == 0x40) || (bVar3 == 0x60)) {
      __return_storage_ptr__->n = 0;
      __return_storage_ptr__->t = (uint)(reader->type_ == '`') << 5 | ByteArray;
      pQVar2 = (QCborContainerPrivate *)operator_new(0x40);
      (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i = 0;
      pQVar2->usedData = 0;
      (pQVar2->data).d.d = (Data *)0x0;
      (pQVar2->data).d.ptr = (char *)0x0;
      (pQVar2->data).d.size = 0;
      (pQVar2->elements).d.d = (Data *)0x0;
      (pQVar2->elements).d.ptr = (Element *)0x0;
      (pQVar2->elements).d.size = 0;
      __return_storage_ptr__->container = pQVar2;
      LOCK();
      (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QCborContainerPrivate::decodeStringFromCbor(__return_storage_ptr__->container,reader);
      goto LAB_002b6e65;
    }
    if ((bVar3 == 0x80) || (bVar3 == 0xa0)) {
      __return_storage_ptr__->n = -1;
      __return_storage_ptr__->t = (reader->type_ != 0x80 | 4) << 5;
      pQVar2 = createContainerFromCbor(reader,0x400);
      __return_storage_ptr__->container = pQVar2;
      goto LAB_002b6e65;
    }
    if (bVar3 == 0xc0) {
      taggedValueFromCbor(&QStack_38,reader,0x400);
      operator=((QCborValue *)__return_storage_ptr__,&QStack_38);
      ~QCborValue((QCborValue *)&QStack_38);
      goto LAB_002b6e65;
    }
    if (bVar3 != 0xe0) {
      if (bVar3 == 0xff) {
        __return_storage_ptr__->t = Invalid;
      }
      goto LAB_002b6e65;
    }
  }
  EVar4 = decodeBasicValueFromCbor(reader);
  __return_storage_ptr__->n = (qint64)EVar4.field_0;
  __return_storage_ptr__->t = EVar4.type;
LAB_002b6e65:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QCborValue QCborValue::fromCbor(QCborStreamReader &reader)
{
    QCborValue result;
    auto t = reader.type();
    if (reader.lastError() != QCborError::NoError)
        t = QCborStreamReader::Invalid;

    switch (t) {
    // basic types, no container needed:
    case QCborStreamReader::UnsignedInteger:
    case QCborStreamReader::NegativeInteger:
    case QCborStreamReader::SimpleType:
    case QCborStreamReader::Float16:
    case QCborStreamReader::Float:
    case QCborStreamReader::Double: {
        Element e = decodeBasicValueFromCbor(reader);
        result.n = e.value;
        result.t = e.type;
        break;
    }

    case QCborStreamReader::Invalid:
        result.t = QCborValue::Invalid;
        break;              // probably a decode error

    // strings
    case QCborStreamReader::ByteArray:
    case QCborStreamReader::String:
        result.n = 0;
        result.t = reader.isString() ? String : ByteArray;
        result.container = new QCborContainerPrivate;
        result.container->ref.ref();
        result.container->decodeStringFromCbor(reader);
        break;

    // containers
    case QCborStreamReader::Array:
    case QCborStreamReader::Map:
        result.n = -1;
        result.t = reader.isArray() ? Array : Map;
        result.container = createContainerFromCbor(reader, MaximumRecursionDepth);
        break;

    // tag
    case QCborStreamReader::Tag:
        result = taggedValueFromCbor(reader, MaximumRecursionDepth);
        break;
    }

    return result;
}